

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O2

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::sort_cells(rasterizer_cells_aa<agg::cell_aa> *this)

{
  sorted_y *psVar1;
  int iVar2;
  uint uVar3;
  sorted_y *psVar4;
  cell_type **ppcVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  cell_type *pcVar10;
  cell_type **ppcVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  
  if (this->m_sorted == false) {
    add_curr_cell(this);
    (this->m_curr_cell).x = 0x7fffffff;
    (this->m_curr_cell).y = 0x7fffffff;
    (this->m_curr_cell).cover = 0;
    (this->m_curr_cell).area = 0;
    if (this->m_num_cells != 0) {
      pod_vector<agg::cell_aa_*>::allocate(&this->m_sorted_cells,this->m_num_cells,0x10);
      pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::allocate
                (&this->m_sorted_y,(this->m_max_y - this->m_min_y) + 1,0x10);
      memset((this->m_sorted_y).m_array,0,(ulong)(this->m_sorted_y).m_size << 3);
      ppcVar5 = this->m_cells;
      iVar2 = this->m_min_y;
      psVar4 = (this->m_sorted_y).m_array;
      uVar6 = this->m_num_cells;
      ppcVar11 = ppcVar5;
      for (uVar9 = uVar6; uVar9 != 0; uVar9 = uVar9 - uVar14) {
        pcVar10 = *ppcVar11;
        uVar14 = uVar9;
        if (0xfff < uVar9) {
          uVar14 = 0x1000;
        }
        for (lVar13 = 0; uVar14 << 4 != (int)lVar13; lVar13 = lVar13 + 0x10) {
          psVar1 = psVar4 + (uint)(*(int *)((long)&pcVar10->y + lVar13) - iVar2);
          psVar1->start = psVar1->start + 1;
        }
        ppcVar11 = ppcVar11 + 1;
      }
      uVar7 = (ulong)(this->m_sorted_y).m_size;
      psVar4 = (this->m_sorted_y).m_array;
      uVar9 = 0;
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        uVar14 = psVar4[uVar8].start;
        psVar4[uVar8].start = uVar9;
        uVar9 = uVar14 + uVar9;
      }
      iVar2 = this->m_min_y;
      for (; uVar6 != 0; uVar6 = uVar6 - uVar14) {
        pcVar10 = *ppcVar5;
        uVar9 = 0x1000;
        uVar14 = 0x1000;
        if (uVar6 < 0x1000) {
          uVar9 = uVar6;
          uVar14 = uVar6;
        }
        while (uVar9 != 0) {
          uVar12 = pcVar10->y - iVar2;
          psVar4 = (this->m_sorted_y).m_array;
          uVar3 = psVar4[uVar12].num;
          (this->m_sorted_cells).m_array[psVar4[uVar12].start + uVar3] = pcVar10;
          psVar4[uVar12].num = uVar3 + 1;
          pcVar10 = pcVar10 + 1;
          uVar9 = uVar9 - 1;
        }
        ppcVar5 = ppcVar5 + 1;
      }
      for (uVar8 = 0; uVar8 < uVar7; uVar8 = uVar8 + 1) {
        psVar4 = (this->m_sorted_y).m_array;
        uVar6 = psVar4[uVar8].num;
        if (uVar6 != 0) {
          qsort_cells<agg::cell_aa>((this->m_sorted_cells).m_array + psVar4[uVar8].start,uVar6);
          uVar7 = (ulong)(this->m_sorted_y).m_size;
        }
      }
      this->m_sorted = true;
    }
  }
  return;
}

Assistant:

void rasterizer_cells_aa<Cell>::sort_cells()
    {
        if(m_sorted) return; //Perform sort only the first time.

        add_curr_cell();
        m_curr_cell.x     = std::numeric_limits<int>::max();
        m_curr_cell.y     = std::numeric_limits<int>::max();
        m_curr_cell.cover = 0;
        m_curr_cell.area  = 0;

        if(m_num_cells == 0) return;

// DBG: Check to see if min/max works well.
//for(unsigned nc = 0; nc < m_num_cells; nc++)
//{
//    cell_type* cell = m_cells[nc >> cell_block_shift] + (nc & cell_block_mask);
//    if(cell->x < m_min_x || 
//       cell->y < m_min_y || 
//       cell->x > m_max_x || 
//       cell->y > m_max_y)
//    {
//        cell = cell; // Breakpoint here
//    }
//}
        // Allocate the array of cell pointers
        m_sorted_cells.allocate(m_num_cells, 16);

        // Allocate and zero the Y array
        m_sorted_y.allocate(m_max_y - m_min_y + 1, 16);
        m_sorted_y.zero();

        // Create the Y-histogram (count the numbers of cells for each Y)
        cell_type** block_ptr = m_cells;
        cell_type*  cell_ptr;
        unsigned nb = m_num_cells;
        unsigned i;
        while(nb)
        {
            cell_ptr = *block_ptr++;
            i = (nb > cell_block_size) ? unsigned(cell_block_size) : nb;
            nb -= i;
            while(i--) 
            {
                m_sorted_y[cell_ptr->y - m_min_y].start++;
                ++cell_ptr;
            }
        }

        // Convert the Y-histogram into the array of starting indexes
        unsigned start = 0;
        for(i = 0; i < m_sorted_y.size(); i++)
        {
            unsigned v = m_sorted_y[i].start;
            m_sorted_y[i].start = start;
            start += v;
        }

        // Fill the cell pointer array sorted by Y
        block_ptr = m_cells;
        nb = m_num_cells;
        while(nb)
        {
            cell_ptr = *block_ptr++;
            i = (nb > cell_block_size) ? unsigned(cell_block_size) : nb;
            nb -= i;
            while(i--)
            {
                sorted_y& curr_y = m_sorted_y[cell_ptr->y - m_min_y];
                m_sorted_cells[curr_y.start + curr_y.num] = cell_ptr;
                ++curr_y.num;
                ++cell_ptr;
            }
        }
        
        // Finally arrange the X-arrays
        for(i = 0; i < m_sorted_y.size(); i++)
        {
            const sorted_y& curr_y = m_sorted_y[i];
            if(curr_y.num)
            {
                qsort_cells(m_sorted_cells.data() + curr_y.start, curr_y.num);
            }
        }
        m_sorted = true;
    }